

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeadModel.cpp
# Opt level: O0

void __thiscall OpenMD::BeadModel::checkElement(BeadModel *this,size_t i)

{
  reference pvVar1;
  size_type in_RSI;
  long in_RDI;
  
  pvVar1 = std::vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
           ::operator[]((vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
                         *)(in_RDI + 0x10),in_RSI);
  if (pvVar1->radius <= 0.0 && pvVar1->radius != 0.0) {
    snprintf(painCave.errMsg,2000,
             "BeadModel::checkElement: There is a bead with a negative radius.\n\tStarting from index 0, check bead (%zu).\n"
             ,in_RSI);
    painCave.isFatal = 1;
    simError();
  }
  pvVar1 = std::vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
           ::operator[]((vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
                         *)(in_RDI + 0x10),in_RSI);
  if (pvVar1->radius <= 1e-14 && pvVar1->radius != 1e-14) {
    pvVar1 = std::
             vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>::
             operator[]((vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
                         *)(in_RDI + 0x10),in_RSI);
    pvVar1->radius = 1e-14;
  }
  return;
}

Assistant:

void BeadModel::checkElement(std::size_t i) {
    // checking if the radius is a non-negative value.
    if (elements_[i].radius < 0) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "BeadModel::checkElement: There is a bead with a negative radius.\n"
          "\tStarting from index 0, check bead (%zu).\n",
          i);
      painCave.isFatal = 1;
      simError();
    }
    // if the bead's radius is below 1.0e-14, substitute by 1.0e-14;
    // to avoid problem in the self-interaction part (i.e., to not divide by
    // zero)
    if (elements_[i].radius < 1.0e-14) elements_[i].radius = 1.0e-14;
  }